

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool __thiscall Input::b1(Input *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RDI;
  bool local_1;
  
  bVar1 = is_joypad_connected();
  if (bVar1) {
    local_1 = (bool)(*(byte *)(in_RDI + 0x184) & 1);
  }
  else {
    uVar2 = al_key_down(in_RDI + 8,0x1a);
    if (((uVar2 & 1) == 0) && (uVar2 = al_key_down(in_RDI + 8,0x19), (uVar2 & 1) == 0)) {
      if (*(long *)(in_RDI + 0x170) != 0) {
        return *(int *)(in_RDI + 0xf0) != 0;
      }
      return false;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Input::b1(void)
{
   if (is_joypad_connected()) {
      return joypad_b;
   }

#ifdef ALLEGRO_IPHONE
   return button_pressed(BB_W-size, BB_H-size, size, size) ? 1 : 0;
#else
   if (al_key_down(&kbdstate, ALLEGRO_KEY_Z) || al_key_down(&kbdstate, ALLEGRO_KEY_Y))
      return true;
   else if (joystick)
      return joystate.button[0];
   else
      return 0;
#endif
}